

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.h
# Opt level: O0

void update_cb_offsets(MACROBLOCK *x,BLOCK_SIZE bsize,int subsampling_x,int subsampling_y)

{
  BLOCK_SIZE BVar1;
  int in_ECX;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  BLOCK_SIZE plane_bsize;
  
  *(ushort *)(in_RDI + 0x4198) =
       *(short *)(in_RDI + 0x4198) +
       (ushort)block_size_wide[in_SIL] * (ushort)block_size_high[in_SIL];
  if ((*(byte *)(in_RDI + 0x1ac) & 1) != 0) {
    BVar1 = get_plane_block_size(in_SIL,in_EDX,in_ECX);
    *(ushort *)(in_RDI + 0x419a) =
         *(short *)(in_RDI + 0x419a) +
         (ushort)block_size_wide[BVar1] * (ushort)block_size_high[BVar1];
  }
  return;
}

Assistant:

static inline void update_cb_offsets(MACROBLOCK *x, const BLOCK_SIZE bsize,
                                     const int subsampling_x,
                                     const int subsampling_y) {
  x->cb_offset[PLANE_TYPE_Y] += block_size_wide[bsize] * block_size_high[bsize];
  if (x->e_mbd.is_chroma_ref) {
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, subsampling_x, subsampling_y);
    assert(plane_bsize != BLOCK_INVALID);
    x->cb_offset[PLANE_TYPE_UV] +=
        block_size_wide[plane_bsize] * block_size_high[plane_bsize];
  }
}